

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf.c
# Opt level: O2

int read_att_array(coda_netcdf_product *product,int64_t *offset,coda_mem_record **attributes,
                  coda_conversion *conversion)

{
  size_t __size;
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  byte bVar11;
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [15];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [15];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [15];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  uint nc_type;
  ushort uVar49;
  int iVar50;
  int iVar51;
  coda_type_record *definition;
  coda_mem_record *pcVar52;
  coda_netcdf_basic_type *base_type;
  coda_netcdf_basic_type *field_type;
  long lVar53;
  char *pcVar54;
  ulong uVar55;
  int64_t iVar56;
  long lVar57;
  float fVar58;
  double dVar59;
  undefined1 uVar70;
  undefined1 uVar71;
  undefined1 uVar73;
  undefined1 uVar74;
  undefined1 uVar75;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 uVar72;
  undefined1 uVar76;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  uint local_c0;
  int local_bc;
  coda_conversion *local_b8;
  int64_t local_b0;
  long local_a8;
  int64_t num_att;
  long dim [8];
  int64_t nelems;
  int64_t string_length;
  undefined1 auVar62 [16];
  
  iVar50 = read_bytes(product->raw_product,*offset,4,&local_bc);
  iVar51 = -1;
  if (iVar50 < 0) {
    return -1;
  }
  auVar60 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_bc >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_bc >> 0x10),local_bc))
                                                  >> 0x20),local_bc) >> 0x18),
                                      (char)((uint)local_bc >> 8)),(ushort)(byte)local_bc) &
                    0xffffff00ffffff);
  auVar60 = pshuflw(auVar60,auVar60,0x1b);
  sVar1 = auVar60._0_2_;
  sVar2 = auVar60._2_2_;
  sVar3 = auVar60._4_2_;
  sVar4 = auVar60._6_2_;
  local_bc = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar60[6] - (0xff < sVar4),
                      CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar60[4] - (0xff < sVar3),
                               CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar60[2] - (0xff < sVar2),
                                        (0 < sVar1) * (sVar1 < 0x100) * auVar60[0] - (0xff < sVar1))
                              ));
  *offset = *offset + 4;
  iVar50 = read_length_value(product,offset,&num_att);
  if (iVar50 != 0) {
    return -1;
  }
  if (local_bc == 0xc) {
    local_b8 = conversion;
    definition = coda_type_record_new(coda_format_netcdf);
    if (definition == (coda_type_record *)0x0) {
      return -1;
    }
    pcVar52 = coda_mem_record_new(definition,(coda_dynamic_type *)0x0);
    *attributes = pcVar52;
    coda_type_release((coda_type *)definition);
    if (*attributes == (coda_mem_record *)0x0) {
      return -1;
    }
    for (lVar57 = 0; lVar57 < num_att; lVar57 = lVar57 + 1) {
      iVar51 = read_length_value(product,offset,&string_length);
      iVar56 = string_length;
      if (iVar51 != 0) goto LAB_00160015;
      __size = string_length + 1;
      pcVar54 = (char *)malloc(__size);
      if (pcVar54 == (char *)0x0) {
        coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",__size,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf.c"
                       ,0xf1);
        goto LAB_00160015;
      }
      pcVar54[iVar56] = '\0';
      iVar51 = read_bytes(product->raw_product,*offset,iVar56,pcVar54);
      if (iVar51 < 0) goto LAB_0015ffed;
      uVar55 = (ulong)((uint)iVar56 & 3);
      lVar53 = ((*offset + iVar56) - uVar55) + 4;
      if (uVar55 == 0) {
        lVar53 = *offset + iVar56;
      }
      *offset = lVar53;
      iVar51 = read_bytes(product->raw_product,lVar53,4,&local_c0);
      if (iVar51 < 0) goto LAB_0015ffed;
      auVar16._1_9_ = SUB169(ZEXT816(0) << 0x40,7);
      auVar16[0] = (char)(local_c0 >> 0x18);
      auVar16._10_6_ = 0;
      auVar62._5_11_ = SUB1611(auVar16 << 0x30,5);
      auVar62[4] = (char)(local_c0 >> 0x10);
      auVar62._0_4_ = local_c0;
      auVar60._12_4_ = 0;
      auVar60._0_12_ = auVar62._4_12_;
      auVar61._3_13_ = SUB1613(auVar60 << 0x20,3);
      auVar61[2] = (char)(local_c0 >> 8);
      auVar61[0] = (byte)local_c0;
      auVar61[1] = 0;
      auVar60 = pshuflw(auVar61,auVar61,0x1b);
      sVar1 = auVar60._0_2_;
      sVar2 = auVar60._2_2_;
      sVar3 = auVar60._4_2_;
      sVar4 = auVar60._6_2_;
      local_c0 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar60[6] - (0xff < sVar4),
                          CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar60[4] - (0xff < sVar3),
                                   CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar60[2] -
                                            (0xff < sVar2),
                                            (0 < sVar1) * (sVar1 < 0x100) * auVar60[0] -
                                            (0xff < sVar1))));
      *offset = *offset + 4;
      iVar51 = read_length_value(product,offset,&nelems);
      nc_type = local_c0;
      if (iVar51 != 0) goto LAB_0015ffed;
      iVar51 = local_c0 - 1;
      lVar53 = nelems;
      switch(iVar51) {
      case 0:
      case 1:
        break;
      case 2:
        lVar53 = nelems * 2;
        break;
      case 3:
      case 4:
        lVar53 = nelems * 4;
        break;
      case 5:
        lVar53 = nelems * 8;
        break;
      default:
        coda_set_error(-300,"invalid netCDF file (invalid netcdf type (%d))",(ulong)local_c0);
        goto LAB_00160075;
      }
      iVar56 = nelems;
      local_a8 = lVar53;
      if (nelems != 1 || local_b8 == (coda_conversion *)0x0) goto LAB_0015fed2;
      local_b0 = nelems;
      iVar50 = strcmp(pcVar54,"scale_factor");
      if ((iVar50 != 0) && (iVar50 = strcmp(pcVar54,"add_offset"), iVar50 != 0)) {
        iVar56 = local_b0;
        if (nc_type != 2) goto LAB_0015fdc2;
        goto LAB_0015fed8;
      }
      iVar56 = local_b0;
      if (nc_type == 2) goto LAB_0015fed8;
      if (nc_type == 6) {
        iVar50 = read_bytes(product->raw_product,*offset,8,dim);
        if (-1 < iVar50) {
          auVar12._8_6_ = 0;
          auVar12._0_8_ = dim[0];
          auVar12[0xe] = (char)((ulong)dim[0] >> 0x38);
          auVar22._8_4_ = 0;
          auVar22._0_8_ = dim[0];
          auVar22[0xc] = (char)((ulong)dim[0] >> 0x30);
          auVar22._13_2_ = auVar12._13_2_;
          auVar33._8_4_ = 0;
          auVar33._0_8_ = dim[0];
          auVar33._12_3_ = auVar22._12_3_;
          auVar37._8_2_ = 0;
          auVar37._0_8_ = dim[0];
          auVar37[10] = (char)((ulong)dim[0] >> 0x28);
          auVar37._11_4_ = auVar33._11_4_;
          auVar41._8_2_ = 0;
          auVar41._0_8_ = dim[0];
          auVar41._10_5_ = auVar37._10_5_;
          auVar45[8] = (char)((ulong)dim[0] >> 0x20);
          auVar45._0_8_ = dim[0];
          auVar45._9_6_ = auVar41._9_6_;
          uVar55 = CONCAT17(0,auVar45._8_7_);
          auVar21._8_8_ = 0;
          auVar21._0_8_ = uVar55;
          auVar20._1_9_ = SUB169(auVar21 << 0x40,7);
          auVar20[0] = (char)((ulong)dim[0] >> 0x18);
          auVar20._10_6_ = 0;
          auVar9._1_11_ = SUB1611(auVar20 << 0x30,5);
          auVar9[0] = (char)((ulong)dim[0] >> 0x10);
          auVar19._12_4_ = 0;
          auVar19._0_12_ = auVar9;
          auVar64._3_13_ = SUB1613(auVar19 << 0x20,3);
          auVar64[2] = (char)((ulong)dim[0] >> 8);
          auVar64[0] = (byte)dim[0];
          auVar64[1] = 0;
          auVar65._8_4_ = auVar64._0_4_;
          auVar65._0_8_ = uVar55;
          auVar65._12_4_ = auVar9._0_4_;
          auVar60 = pshuflw(auVar65,auVar65,0x1b);
          auVar60 = pshufhw(auVar60,auVar60,0x1b);
          sVar1 = auVar60._0_2_;
          sVar2 = auVar60._2_2_;
          sVar3 = auVar60._4_2_;
          sVar4 = auVar60._6_2_;
          sVar5 = auVar60._8_2_;
          sVar6 = auVar60._10_2_;
          sVar7 = auVar60._12_2_;
          sVar8 = auVar60._14_2_;
          dim[0] = CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar60[0xe] - (0xff < sVar8),
                            CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar60[0xc] - (0xff < sVar7),
                                     CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar60[10] -
                                              (0xff < sVar6),
                                              CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar60[8] -
                                                       (0xff < sVar5),
                                                       CONCAT13((0 < sVar4) * (sVar4 < 0x100) *
                                                                auVar60[6] - (0xff < sVar4),
                                                                CONCAT12((0 < sVar3) *
                                                                         (sVar3 < 0x100) *
                                                                         auVar60[4] - (0xff < sVar3)
                                                                         ,CONCAT11((0 < sVar2) *
                                                                                   (sVar2 < 0x100) *
                                                                                   auVar60[2] -
                                                                                   (0xff < sVar2),
                                                                                   (0 < sVar1) *
                                                                                   (sVar1 < 0x100) *
                                                                                   auVar60[0] -
                                                                                   (0xff < sVar1))))
                                                      ))));
          (&local_b8->numerator)[(ulong)(*pcVar54 != 's') * 2] = (double)dim[0];
          goto LAB_0015fdc2;
        }
        goto LAB_00160075;
      }
      if (nc_type == 5) {
        iVar50 = read_bytes(product->raw_product,*offset,4,dim);
        if (iVar50 < 0) goto LAB_00160075;
        auVar18._1_9_ = SUB169(ZEXT816(0) << 0x40,7);
        auVar18[0] = (char)((ulong)dim[0] >> 0x18);
        auVar18._10_6_ = 0;
        auVar17._1_11_ = SUB1611(auVar18 << 0x30,5);
        auVar17[0] = (char)((ulong)dim[0] >> 0x10);
        auVar17._12_4_ = 0;
        auVar63._3_13_ = SUB1613(auVar17 << 0x20,3);
        auVar63[2] = (char)((ulong)dim[0] >> 8);
        auVar63[0] = (byte)dim[0];
        auVar63[1] = 0;
        auVar60 = pshuflw(auVar63,auVar63,0x1b);
        sVar1 = auVar60._0_2_;
        sVar2 = auVar60._2_2_;
        sVar3 = auVar60._4_2_;
        sVar4 = auVar60._6_2_;
        fVar58 = (float)CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar60[6] - (0xff < sVar4),
                                 CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar60[4] -
                                          (0xff < sVar3),
                                          CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar60[2] -
                                                   (0xff < sVar2),
                                                   (0 < sVar1) * (sVar1 < 0x100) * auVar60[0] -
                                                   (0xff < sVar1))));
        dim[0] = CONCAT44(dim[0]._4_4_,fVar58);
        (&local_b8->numerator)[(ulong)(*pcVar54 != 's') * 2] = (double)fVar58;
      }
LAB_0015fdc2:
      iVar50 = strcmp(pcVar54,"missing_value");
      if ((iVar50 != 0) &&
         ((iVar50 = strcmp(pcVar54,"_FillValue"), iVar50 != 0 ||
          (iVar50 = coda_isNaN(local_b8->invalid_value), iVar50 == 0)))) goto LAB_0015fed2;
      iVar50 = read_bytes(product->raw_product,*offset,local_a8,dim);
      if (iVar50 < 0) goto LAB_00160075;
      uVar70 = (undefined1)((ulong)dim[0] >> 8);
      uVar71 = (undefined1)((ulong)dim[0] >> 0x10);
      uVar72 = (undefined1)((ulong)dim[0] >> 0x18);
      uVar73 = (undefined1)((ulong)dim[0] >> 0x20);
      uVar74 = (undefined1)((ulong)dim[0] >> 0x28);
      uVar75 = (undefined1)((ulong)dim[0] >> 0x30);
      uVar76 = (undefined1)((ulong)dim[0] >> 0x38);
      switch(iVar51) {
      case 0:
        iVar51 = (int)(char)(byte)dim[0];
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf.c"
                      ,0x1af,
                      "int read_att_array(coda_netcdf_product *, int64_t *, coda_mem_record **, coda_conversion *)"
                     );
      case 2:
        uVar49 = (ushort)dim[0] << 8 | (ushort)dim[0] >> 8;
        dim[0] = CONCAT62(dim[0]._2_6_,uVar49);
        iVar51 = (int)(short)uVar49;
        break;
      case 3:
        auVar14._8_6_ = 0;
        auVar14._0_8_ = dim[0];
        auVar14[0xe] = uVar76;
        auVar29._8_4_ = 0;
        auVar29._0_8_ = dim[0];
        auVar29[0xc] = uVar75;
        auVar29._13_2_ = auVar14._13_2_;
        auVar35._8_4_ = 0;
        auVar35._0_8_ = dim[0];
        auVar35._12_3_ = auVar29._12_3_;
        auVar39._8_2_ = 0;
        auVar39._0_8_ = dim[0];
        auVar39[10] = uVar74;
        auVar39._11_4_ = auVar35._11_4_;
        auVar43._8_2_ = 0;
        auVar43._0_8_ = dim[0];
        auVar43._10_5_ = auVar39._10_5_;
        auVar47[8] = uVar73;
        auVar47._0_8_ = dim[0];
        auVar47._9_6_ = auVar43._9_6_;
        auVar28._1_9_ = SUB169(ZEXT716(auVar47._8_7_) << 0x40,7);
        auVar28[0] = uVar72;
        auVar28._10_6_ = 0;
        auVar27._1_11_ = SUB1611(auVar28 << 0x30,5);
        auVar27[0] = uVar71;
        auVar27._12_4_ = 0;
        auVar68._3_13_ = SUB1613(auVar27 << 0x20,3);
        auVar68[2] = uVar70;
        auVar68[1] = 0;
        auVar68[0] = (byte)dim[0];
        auVar60 = pshuflw(auVar68,auVar68,0x1b);
        sVar1 = auVar60._0_2_;
        sVar2 = auVar60._2_2_;
        sVar3 = auVar60._4_2_;
        sVar4 = auVar60._6_2_;
        iVar51 = CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar60[6] - (0xff < sVar4),
                          CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar60[4] - (0xff < sVar3),
                                   CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar60[2] -
                                            (0xff < sVar2),
                                            (0 < sVar1) * (sVar1 < 0x100) * auVar60[0] -
                                            (0xff < sVar1))));
        dim[0] = CONCAT44(dim[0]._4_4_,iVar51);
        break;
      case 4:
        auVar15._8_6_ = 0;
        auVar15._0_8_ = dim[0];
        auVar15[0xe] = uVar76;
        auVar32._8_4_ = 0;
        auVar32._0_8_ = dim[0];
        auVar32[0xc] = uVar75;
        auVar32._13_2_ = auVar15._13_2_;
        auVar36._8_4_ = 0;
        auVar36._0_8_ = dim[0];
        auVar36._12_3_ = auVar32._12_3_;
        auVar40._8_2_ = 0;
        auVar40._0_8_ = dim[0];
        auVar40[10] = uVar74;
        auVar40._11_4_ = auVar36._11_4_;
        auVar44._8_2_ = 0;
        auVar44._0_8_ = dim[0];
        auVar44._10_5_ = auVar40._10_5_;
        auVar48[8] = uVar73;
        auVar48._0_8_ = dim[0];
        auVar48._9_6_ = auVar44._9_6_;
        auVar31._1_9_ = SUB169(ZEXT716(auVar48._8_7_) << 0x40,7);
        auVar31[0] = uVar72;
        auVar31._10_6_ = 0;
        auVar30._1_11_ = SUB1611(auVar31 << 0x30,5);
        auVar30[0] = uVar71;
        auVar30._12_4_ = 0;
        auVar69._3_13_ = SUB1613(auVar30 << 0x20,3);
        auVar69[2] = uVar70;
        auVar69[1] = 0;
        auVar69[0] = (byte)dim[0];
        auVar60 = pshuflw(auVar69,auVar69,0x1b);
        sVar1 = auVar60._0_2_;
        sVar2 = auVar60._2_2_;
        sVar3 = auVar60._4_2_;
        sVar4 = auVar60._6_2_;
        fVar58 = (float)CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar60[6] - (0xff < sVar4),
                                 CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar60[4] -
                                          (0xff < sVar3),
                                          CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar60[2] -
                                                   (0xff < sVar2),
                                                   (0 < sVar1) * (sVar1 < 0x100) * auVar60[0] -
                                                   (0xff < sVar1))));
        dim[0] = CONCAT44(dim[0]._4_4_,fVar58);
        dVar59 = (double)fVar58;
        goto LAB_0015fec8;
      case 5:
        auVar13._8_6_ = 0;
        auVar13._0_8_ = dim[0];
        auVar13[0xe] = uVar76;
        auVar26._8_4_ = 0;
        auVar26._0_8_ = dim[0];
        auVar26[0xc] = uVar75;
        auVar26._13_2_ = auVar13._13_2_;
        auVar34._8_4_ = 0;
        auVar34._0_8_ = dim[0];
        auVar34._12_3_ = auVar26._12_3_;
        auVar38._8_2_ = 0;
        auVar38._0_8_ = dim[0];
        auVar38[10] = uVar74;
        auVar38._11_4_ = auVar34._11_4_;
        auVar42._8_2_ = 0;
        auVar42._0_8_ = dim[0];
        auVar42._10_5_ = auVar38._10_5_;
        auVar46[8] = uVar73;
        auVar46._0_8_ = dim[0];
        auVar46._9_6_ = auVar42._9_6_;
        uVar55 = CONCAT17(0,auVar46._8_7_);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = uVar55;
        auVar24._1_9_ = SUB169(auVar25 << 0x40,7);
        auVar24[0] = uVar72;
        auVar24._10_6_ = 0;
        auVar10._1_11_ = SUB1611(auVar24 << 0x30,5);
        auVar10[0] = uVar71;
        auVar23._12_4_ = 0;
        auVar23._0_12_ = auVar10;
        auVar66._3_13_ = SUB1613(auVar23 << 0x20,3);
        auVar66[2] = uVar70;
        auVar66[1] = 0;
        auVar66[0] = (byte)dim[0];
        auVar67._8_4_ = auVar66._0_4_;
        auVar67._0_8_ = uVar55;
        auVar67._12_4_ = auVar10._0_4_;
        auVar60 = pshuflw(auVar67,auVar67,0x1b);
        auVar60 = pshufhw(auVar60,auVar60,0x1b);
        sVar1 = auVar60._0_2_;
        sVar2 = auVar60._2_2_;
        sVar3 = auVar60._4_2_;
        sVar4 = auVar60._6_2_;
        sVar5 = auVar60._8_2_;
        sVar6 = auVar60._10_2_;
        sVar7 = auVar60._12_2_;
        sVar8 = auVar60._14_2_;
        dVar59 = (double)CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar60[0xe] - (0xff < sVar8),
                                  CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar60[0xc] -
                                           (0xff < sVar7),
                                           CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar60[10] -
                                                    (0xff < sVar6),
                                                    CONCAT14((0 < sVar5) * (sVar5 < 0x100) *
                                                             auVar60[8] - (0xff < sVar5),
                                                             CONCAT13((0 < sVar4) * (sVar4 < 0x100)
                                                                      * auVar60[6] - (0xff < sVar4),
                                                                      CONCAT12((0 < sVar3) *
                                                                               (sVar3 < 0x100) *
                                                                               auVar60[4] -
                                                                               (0xff < sVar3),
                                                                               CONCAT11((0 < sVar2)
                                                                                        * (sVar2 < 
                                                  0x100) * auVar60[2] - (0xff < sVar2),
                                                  (0 < sVar1) * (sVar1 < 0x100) * auVar60[0] -
                                                  (0xff < sVar1))))))));
        dim[0] = (long)dVar59;
        goto LAB_0015fec8;
      }
      dVar59 = (double)iVar51;
LAB_0015fec8:
      local_b8->invalid_value = dVar59;
LAB_0015fed2:
      if (nc_type == 2) {
LAB_0015fed8:
        base_type = coda_netcdf_basic_type_new(2,*offset,0,iVar56);
        bVar11 = 1;
      }
      else {
        bVar11 = 0;
        base_type = coda_netcdf_basic_type_new(nc_type,*offset,0,1);
      }
      if (base_type == (coda_netcdf_basic_type *)0x0) {
LAB_00160075:
        free(pcVar54);
        pcVar52 = *attributes;
LAB_00160019:
        coda_dynamic_type_delete((coda_dynamic_type *)pcVar52);
        return -1;
      }
      uVar55 = (ulong)((uint)local_a8 & 3);
      lVar53 = ((*offset + local_a8) - uVar55) + 4;
      if (uVar55 == 0) {
        lVar53 = *offset + local_a8;
      }
      *offset = lVar53;
      if ((bool)(bVar11 | iVar56 == 1)) {
        iVar51 = coda_mem_record_add_field(*attributes,pcVar54,(coda_dynamic_type *)base_type,1);
        if (iVar51 != 0) {
          coda_dynamic_type_delete((coda_dynamic_type *)base_type);
LAB_0015ffed:
          free(pcVar54);
LAB_00160015:
          pcVar52 = *attributes;
          goto LAB_00160019;
        }
      }
      else {
        dim[0] = iVar56;
        field_type = (coda_netcdf_basic_type *)coda_netcdf_array_new(1,dim,base_type);
        if ((field_type == (coda_netcdf_basic_type *)0x0) ||
           (iVar51 = coda_mem_record_add_field
                               (*attributes,pcVar54,(coda_dynamic_type *)field_type,1),
           base_type = field_type, iVar51 != 0)) {
          coda_dynamic_type_delete((coda_dynamic_type *)base_type);
          free(pcVar54);
          coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
          return -1;
        }
      }
      free(pcVar54);
    }
LAB_0015ffe4:
    iVar51 = 0;
  }
  else {
    if (local_bc == 0) {
      *attributes = (coda_mem_record *)0x0;
      if (num_att == 0) goto LAB_0015ffe4;
      pcVar54 = "invalid netCDF file (invalid value for nelems for empty att_array)";
    }
    else {
      pcVar54 = "invalid netCDF file (invalid value for NC_ATTRIBUTE tag)";
    }
    coda_set_error(-300,pcVar54);
  }
  return iVar51;
}

Assistant:

static int read_att_array(coda_netcdf_product *product, int64_t *offset, coda_mem_record **attributes,
                          coda_conversion *conversion)
{
    coda_type_record *attributes_definition;
    int32_t tag;
    int64_t num_att;
    long i;

    if (read_bytes(product->raw_product, *offset, 4, &tag) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&tag);
#endif
    *offset += 4;

    if (read_length_value(product, offset, &num_att) != 0)
    {
        return -1;
    }
    if (tag == 0)
    {
        *attributes = NULL;
        if (num_att != 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid value for nelems for empty att_array)");
            return -1;
        }
        return 0;
    }

    if (tag != 12)      /* NC_ATTRIBUTE */
    {
        coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid value for NC_ATTRIBUTE tag)");
        return -1;
    }

    attributes_definition = coda_type_record_new(coda_format_netcdf);
    if (attributes_definition == NULL)
    {
        return -1;
    }
    *attributes = coda_mem_record_new(attributes_definition, NULL);
    coda_type_release((coda_type *)attributes_definition);
    if (*attributes == NULL)
    {
        return -1;
    }

    for (i = 0; i < num_att; i++)
    {
        coda_netcdf_basic_type *basic_type;
        int64_t string_length;
        int32_t nc_type;
        int64_t nelems;
        long value_length;
        char *name;

        /* nelems */
        if (read_length_value(product, offset, &string_length) != 0)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        /* chars */
        name = malloc(string_length + 1);
        if (name == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)(string_length + 1), __FILE__, __LINE__);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        name[string_length] = '\0';
        if (read_bytes(product->raw_product, *offset, string_length, name) < 0)
        {
            free(name);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        *offset += string_length;
        /* chars padding */
        if ((string_length & 3) != 0)
        {
            *offset += 4 - (string_length & 3);
        }
        /* nc_type */
        if (read_bytes(product->raw_product, *offset, 4, &nc_type) < 0)
        {
            free(name);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap_int32(&nc_type);
#endif
        *offset += 4;
        /* nelems */
        if (read_length_value(product, offset, &nelems) != 0)
        {
            free(name);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        value_length = (long)nelems;
        switch (nc_type)
        {
            case 1:
            case 2:
                break;
            case 3:
                value_length *= 2;
                break;
            case 4:
            case 5:
                value_length *= 4;
                break;
            case 6:
                value_length *= 8;
                break;
            default:
                coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid netcdf type (%d))", (int)nc_type);
                free(name);
                coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                return -1;
        }

        if (conversion != NULL)
        {
            if (nelems == 1 && (strcmp(name, "scale_factor") == 0 || strcmp(name, "add_offset") == 0))
            {
                if (nc_type == 5)
                {
                    float value;

                    if (read_bytes(product->raw_product, *offset, 4, &value) < 0)
                    {
                        free(name);
                        coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                        return -1;
                    }
#ifndef WORDS_BIGENDIAN
                    swap_float(&value);
#endif
                    if (name[0] == 's')
                    {
                        conversion->numerator = value;
                    }
                    else
                    {
                        conversion->add_offset = value;
                    }
                }
                else if (nc_type == 6)
                {
                    double value;

                    if (read_bytes(product->raw_product, *offset, 8, &value) < 0)
                    {
                        free(name);
                        coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                        return -1;
                    }
#ifndef WORDS_BIGENDIAN
                    swap_double(&value);
#endif
                    if (name[0] == 's')
                    {
                        conversion->numerator = value;
                    }
                    else
                    {
                        conversion->add_offset = value;
                    }
                }
            }
            /* note that missing_value has preference over _FillValue */
            /* We therefore don't modify fill_value for _FillValue if fill_value was already set */
            if (nelems == 1 && nc_type != 2 && (strcmp(name, "missing_value") == 0 ||
                                                (strcmp(name, "_FillValue") == 0 &&
                                                 coda_isNaN(conversion->invalid_value))))
            {
                union
                {
                    int8_t as_int8[8];
                    uint8_t as_uint8[8];
                    int16_t as_int16[4];
                    uint16_t as_uint16[4];
                    int32_t as_int32[2];
                    uint32_t as_uint32[2];
                    int64_t as_int64[1];
                    uint64_t as_uint64[1];
                    float as_float[2];
                    double as_double[1];
                } value;

                if (read_bytes(product->raw_product, *offset, value_length, value.as_int8) < 0)
                {
                    free(name);
                    coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                    return -1;
                }
                switch (nc_type)
                {
                    case 1:
                        conversion->invalid_value = (double)value.as_int8[0];
                        break;
                    case 3:
#ifndef WORDS_BIGENDIAN
                        swap_int16(value.as_int16);
#endif
                        conversion->invalid_value = (double)value.as_int16[0];
                        break;
                    case 4:
#ifndef WORDS_BIGENDIAN
                        swap_int32(value.as_int32);
#endif
                        conversion->invalid_value = (double)value.as_int32[0];
                        break;
                    case 5:
#ifndef WORDS_BIGENDIAN
                        swap_float(value.as_float);
#endif
                        conversion->invalid_value = (double)value.as_float[0];
                        break;
                    case 6:
#ifndef WORDS_BIGENDIAN
                        swap_double(value.as_double);
#endif
                        conversion->invalid_value = value.as_double[0];
                        break;
                    case 7:
                        conversion->invalid_value = (double)value.as_uint8[0];
                        break;
                    case 8:
#ifndef WORDS_BIGENDIAN
                        swap_uint16(value.as_uint16);
#endif
                        conversion->invalid_value = (double)value.as_uint16[0];
                        break;
                    case 9:
#ifndef WORDS_BIGENDIAN
                        swap_uint32(value.as_uint32);
#endif
                        conversion->invalid_value = (double)value.as_uint32[0];
                        break;
                    case 10:
#ifndef WORDS_BIGENDIAN
                        swap_int64(value.as_int64);
#endif
                        conversion->invalid_value = (double)value.as_int64[0];
                        break;
                    case 11:
#ifndef WORDS_BIGENDIAN
                        swap_uint64(value.as_uint64);
#endif
                        conversion->invalid_value = (double)value.as_uint64[0];
                        break;
                    default:
                        assert(0);
                        exit(1);
                }
            }
        }

        if (nc_type == 2)       /* treat char arrays as strings */
        {
            basic_type = coda_netcdf_basic_type_new(nc_type, *offset, 0, nelems);
        }
        else
        {
            basic_type = coda_netcdf_basic_type_new(nc_type, *offset, 0, 1);
        }
        if (basic_type == NULL)
        {
            free(name);
            coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
            return -1;
        }
        *offset += value_length;
        if ((value_length & 3) != 0)
        {
            *offset += 4 - (value_length & 3);
        }

        if (nc_type == 2 || nelems == 1)
        {
            if (coda_mem_record_add_field(*attributes, name, (coda_dynamic_type *)basic_type, 1) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)basic_type);
                free(name);
                coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                return -1;
            }
        }
        else
        {
            coda_netcdf_array *array;
            long dim[CODA_MAX_NUM_DIMS];

            dim[0] = (long)nelems;
            array = coda_netcdf_array_new(1, dim, basic_type);
            if (array == NULL)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)basic_type);
                free(name);
                coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                return -1;
            }
            if (coda_mem_record_add_field(*attributes, name, (coda_dynamic_type *)array, 1) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)array);
                free(name);
                coda_dynamic_type_delete((coda_dynamic_type *)*attributes);
                return -1;
            }
        }
        free(name);
    }

    return 0;
}